

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::applyUnknownInvocationToScope(CheckerVisitor *this)

{
  VarScope *pVVar1;
  ValueRef *this_00;
  __node_base *p_Var2;
  VarScope **ppVVar3;
  
  ppVVar3 = &this->currentScope;
  while (pVVar1 = *ppVVar3, pVVar1 != (VarScope *)0x0) {
    p_Var2 = &(pVVar1->symbols)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      this_00 = *(ValueRef **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
      if (this_00->info->kind == SK_VAR) {
        if (this->currentInfo != (FunctionInfo *)0x0) {
          FunctionInfo::addModifiable
                    (this->currentInfo,(SQChar *)p_Var2[1]._M_nxt,this_00->info->ownedScope->owner);
          this_00 = *(ValueRef **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
        }
        ValueRef::kill(this_00,4,1);
      }
    }
    ppVVar3 = &pVVar1->parent;
  }
  return;
}

Assistant:

void CheckerVisitor::applyUnknownInvocationToScope() {
  VarScope *s = currentScope;

  while (s) {
    auto &symbols = s->symbols;
    for (auto &sym : symbols) {
      if (sym.second->isConstant())
        continue;
      if (currentInfo) {
        currentInfo->addModifiable(sym.first, sym.second->info->ownedScope->owner);
      }
      sym.second->kill();
    }
    s = s->parent;
  }
}